

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

QStringList * __thiscall
QCommandLineParser::values
          (QStringList *__return_storage_ptr__,QCommandLineParser *this,QString *optionName)

{
  QCommandLineParserPrivate *pQVar1;
  Span *pSVar2;
  Data *pDVar3;
  QString *pQVar4;
  qsizetype qVar5;
  ulong uVar6;
  QStringList *values;
  QCommandLineOption *this_00;
  long in_FS_OFFSET;
  const_iterator cVar7;
  qsizetype optionOffset;
  QArrayDataPointer<QString> local_58;
  long local_40;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar7 = QHash<QString,_long_long>::constFindImpl<QString>(&this->d->nameHash,optionName);
  if (cVar7.i.d == (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0 && cVar7.i.bucket == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QString *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    pQVar1 = this->d;
    pSVar2 = (cVar7.i.d)->spans;
    uVar6 = cVar7.i.bucket >> 7;
    local_40 = *(long *)(pSVar2[uVar6].entries[pSVar2[uVar6].offsets[(uint)cVar7.i.bucket & 0x7f]].
                         storage.data + 0x18);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QHash<long_long,_QList<QString>_>::value
              (__return_storage_ptr__,&pQVar1->optionValuesHash,&local_40);
    if ((__return_storage_ptr__->d).size == 0) {
      this_00 = (this->d->commandLineOptionList).d.ptr + local_40;
      QCommandLineOption::valueName((QString *)&local_38,this_00);
      if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d)->super_QArrayData,2,0x10);
        }
      }
      QCommandLineOption::defaultValues((QStringList *)&local_58,this_00);
      qVar5 = local_58.size;
      pQVar4 = local_58.ptr;
      pDVar3 = local_58.d;
      local_58.size = 0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (QString *)0x0;
      local_38.d = (__return_storage_ptr__->d).d;
      local_38.ptr = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = pQVar4;
      local_38.size = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = qVar5;
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCommandLineParser::values(const QString &optionName) const
{
    d->checkParsed("values");
    auto it = d->nameHash.constFind(optionName);
    if (it != d->nameHash.cend()) {
        const qsizetype optionOffset = *it;
        QStringList values = d->optionValuesHash.value(optionOffset);
        if (values.isEmpty()) {
            const auto &option = d->commandLineOptionList.at(optionOffset);
            if (option.valueName().isEmpty()) {
                qWarning("QCommandLineParser: option not expecting values: \"%ls\"",
                         qUtf16Printable(optionName));
            }
            values = option.defaultValues();
        }
        return values;
    }

    qWarning("QCommandLineParser: option not defined: \"%ls\"", qUtf16Printable(optionName));
    return QStringList();
}